

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void iadst8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  uint uVar72;
  uint uVar73;
  int iVar74;
  int32_t *piVar75;
  int in_ECX;
  uint uVar76;
  uint uVar77;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar78 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i x;
  __m256i v [8];
  __m256i u [8];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i kZero;
  __m256i rnding;
  __m256i cospi32;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospi16;
  __m256i cospi12;
  __m256i cospi52;
  __m256i cospi28;
  __m256i cospi36;
  __m256i cospi44;
  __m256i cospi20;
  __m256i cospi60;
  __m256i cospi4;
  int32_t *cospi;
  int local_1e04;
  char local_1df8;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  undefined8 in_stack_ffffffffffffe240;
  undefined8 in_stack_ffffffffffffe248;
  undefined4 in_stack_ffffffffffffe250;
  undefined4 in_stack_ffffffffffffe254;
  undefined8 in_stack_ffffffffffffe258;
  undefined8 in_stack_ffffffffffffe260;
  undefined8 in_stack_ffffffffffffe268;
  longlong in_stack_ffffffffffffe270;
  undefined1 in_stack_ffffffffffffe280 [24];
  undefined4 in_stack_ffffffffffffe298;
  undefined8 uVar86;
  undefined8 uVar87;
  longlong lVar88;
  undefined1 local_1d40 [32];
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined1 local_1c20 [16];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1bc0 [16];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  char local_18fc;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_490;
  undefined8 uStack_488;
  __m256i *local_3e0;
  __m256i *palStack_3d8;
  __m256i *palStack_3d0;
  longlong lStack_3c8;
  __m256i *palStack_388;
  ulong uStack_58;
  
  piVar75 = cospi_arr(in_EDX);
  uVar77 = piVar75[4];
  auVar78 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar78 = vpinsrd_avx(auVar78,uVar77,2);
  auVar78 = vpinsrd_avx(auVar78,uVar77,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar1 = vpinsrd_avx(auVar1,uVar77,2);
  auVar1 = vpinsrd_avx(auVar1,uVar77,3);
  uStack_790 = auVar1._0_8_;
  uStack_788 = auVar1._8_8_;
  uVar77 = piVar75[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar1 = vpinsrd_avx(auVar1,uVar77,2);
  auVar1 = vpinsrd_avx(auVar1,uVar77,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar2 = vpinsrd_avx(auVar2,uVar77,2);
  auVar2 = vpinsrd_avx(auVar2,uVar77,3);
  uStack_750 = auVar2._0_8_;
  uStack_748 = auVar2._8_8_;
  uVar77 = piVar75[0x14];
  auVar2 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar2 = vpinsrd_avx(auVar2,uVar77,2);
  auVar2 = vpinsrd_avx(auVar2,uVar77,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar3 = vpinsrd_avx(auVar3,uVar77,2);
  auVar3 = vpinsrd_avx(auVar3,uVar77,3);
  uStack_710 = auVar3._0_8_;
  uStack_708 = auVar3._8_8_;
  uVar77 = piVar75[0x2c];
  auVar3 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar3 = vpinsrd_avx(auVar3,uVar77,2);
  auVar3 = vpinsrd_avx(auVar3,uVar77,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
  auVar4 = vpinsrd_avx(auVar4,uVar77,2);
  auVar4 = vpinsrd_avx(auVar4,uVar77,3);
  uStack_6d0 = auVar4._0_8_;
  uStack_6c8 = auVar4._8_8_;
  uVar79 = piVar75[0x24];
  auVar4 = vpinsrd_avx(ZEXT416(uVar79),uVar79,1);
  auVar4 = vpinsrd_avx(auVar4,uVar79,2);
  auVar4 = vpinsrd_avx(auVar4,uVar79,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar79),uVar79,1);
  auVar5 = vpinsrd_avx(auVar5,uVar79,2);
  auVar5 = vpinsrd_avx(auVar5,uVar79,3);
  uStack_690 = auVar5._0_8_;
  uStack_688 = auVar5._8_8_;
  uVar80 = piVar75[0x1c];
  auVar5 = vpinsrd_avx(ZEXT416(uVar80),uVar80,1);
  auVar5 = vpinsrd_avx(auVar5,uVar80,2);
  auVar5 = vpinsrd_avx(auVar5,uVar80,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar80),uVar80,1);
  auVar6 = vpinsrd_avx(auVar6,uVar80,2);
  auVar6 = vpinsrd_avx(auVar6,uVar80,3);
  uStack_650 = auVar6._0_8_;
  uStack_648 = auVar6._8_8_;
  uVar81 = piVar75[0x34];
  auVar6 = vpinsrd_avx(ZEXT416(uVar81),uVar81,1);
  auVar6 = vpinsrd_avx(auVar6,uVar81,2);
  auVar6 = vpinsrd_avx(auVar6,uVar81,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar81),uVar81,1);
  auVar7 = vpinsrd_avx(auVar7,uVar81,2);
  auVar7 = vpinsrd_avx(auVar7,uVar81,3);
  uStack_610 = auVar7._0_8_;
  uStack_608 = auVar7._8_8_;
  uVar82 = piVar75[0xc];
  auVar7 = vpinsrd_avx(ZEXT416(uVar82),uVar82,1);
  auVar7 = vpinsrd_avx(auVar7,uVar82,2);
  auVar7 = vpinsrd_avx(auVar7,uVar82,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar82),uVar82,1);
  auVar8 = vpinsrd_avx(auVar8,uVar82,2);
  auVar8 = vpinsrd_avx(auVar8,uVar82,3);
  uStack_5d0 = auVar8._0_8_;
  uStack_5c8 = auVar8._8_8_;
  uVar83 = piVar75[0x10];
  auVar8 = vpinsrd_avx(ZEXT416(uVar83),uVar83,1);
  auVar8 = vpinsrd_avx(auVar8,uVar83,2);
  auVar8 = vpinsrd_avx(auVar8,uVar83,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar83),uVar83,1);
  auVar9 = vpinsrd_avx(auVar9,uVar83,2);
  auVar9 = vpinsrd_avx(auVar9,uVar83,3);
  uStack_590 = auVar9._0_8_;
  uStack_588 = auVar9._8_8_;
  uVar84 = piVar75[0x30];
  auVar9 = vpinsrd_avx(ZEXT416(uVar84),uVar84,1);
  auVar9 = vpinsrd_avx(auVar9,uVar84,2);
  auVar9 = vpinsrd_avx(auVar9,uVar84,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar84),uVar84,1);
  auVar10 = vpinsrd_avx(auVar10,uVar84,2);
  auVar10 = vpinsrd_avx(auVar10,uVar84,3);
  uStack_550 = auVar10._0_8_;
  uStack_548 = auVar10._8_8_;
  uVar72 = -piVar75[0x30];
  auVar10 = vpinsrd_avx(ZEXT416(uVar72),uVar72,1);
  auVar10 = vpinsrd_avx(auVar10,uVar72,2);
  auVar10 = vpinsrd_avx(auVar10,uVar72,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar72),uVar72,1);
  auVar11 = vpinsrd_avx(auVar11,uVar72,2);
  auVar11 = vpinsrd_avx(auVar11,uVar72,3);
  uStack_510 = auVar11._0_8_;
  uStack_508 = auVar11._8_8_;
  uVar85 = piVar75[0x20];
  auVar11 = vpinsrd_avx(ZEXT416(uVar85),uVar85,1);
  auVar11 = vpinsrd_avx(auVar11,uVar85,2);
  auVar11 = vpinsrd_avx(auVar11,uVar85,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar85),uVar85,1);
  auVar12 = vpinsrd_avx(auVar12,uVar85,2);
  auVar12 = vpinsrd_avx(auVar12,uVar85,3);
  uStack_4d0 = auVar12._0_8_;
  uStack_4c8 = auVar12._8_8_;
  local_18fc = (char)in_EDX;
  uVar73 = 1 << (local_18fc - 1U & 0x1f);
  auVar12 = vpinsrd_avx(ZEXT416(uVar73),uVar73,1);
  auVar12 = vpinsrd_avx(auVar12,uVar73,2);
  auVar12 = vpinsrd_avx(auVar12,uVar73,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar73),uVar73,1);
  auVar13 = vpinsrd_avx(auVar13,uVar73,2);
  auVar13 = vpinsrd_avx(auVar13,uVar73,3);
  uStack_490 = auVar13._0_8_;
  uStack_488 = auVar13._8_8_;
  uStack_58 = SUB328(ZEXT832(0),4);
  iVar74 = 8;
  if (in_ECX != 0) {
    iVar74 = 6;
  }
  if (in_R8D + iVar74 < 0x10) {
    local_1df8 = '\x10';
  }
  else {
    local_1df8 = '\b';
    if (in_ECX != 0) {
      local_1df8 = '\x06';
    }
    local_1df8 = (char)in_R8D + local_1df8;
  }
  uVar76 = -(1 << (local_1df8 - 1U & 0x1f));
  auVar13 = vpinsrd_avx(ZEXT416(uVar76),uVar76,1);
  auVar13 = vpinsrd_avx(auVar13,uVar76,2);
  vpinsrd_avx(auVar13,uVar76,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar76),uVar76,1);
  auVar13 = vpinsrd_avx(auVar13,uVar76,2);
  vpinsrd_avx(auVar13,uVar76,3);
  uVar76 = (1 << (local_1df8 - 1U & 0x1f)) - 1;
  auVar13 = vpinsrd_avx(ZEXT416(uVar76),uVar76,1);
  auVar13 = vpinsrd_avx(auVar13,uVar76,2);
  vpinsrd_avx(auVar13,uVar76,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar76),uVar76,1);
  auVar13 = vpinsrd_avx(auVar13,uVar76,2);
  vpinsrd_avx(auVar13,uVar76,3);
  auVar53._16_8_ = uStack_790;
  auVar53._0_16_ = auVar78;
  auVar53._24_8_ = uStack_788;
  auVar14 = vpmulld_avx2(in_RDI[7],auVar53);
  auVar52._16_8_ = uStack_750;
  auVar52._0_16_ = auVar1;
  auVar52._24_8_ = uStack_748;
  auVar15 = vpmulld_avx2(*in_RDI,auVar52);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar69._16_8_ = uStack_490;
  auVar69._0_16_ = auVar12;
  auVar69._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar69);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar51._16_8_ = uStack_750;
  auVar51._0_16_ = auVar1;
  auVar51._24_8_ = uStack_748;
  auVar14 = vpmulld_avx2(in_RDI[7],auVar51);
  auVar50._16_8_ = uStack_790;
  auVar50._0_16_ = auVar78;
  auVar50._24_8_ = uStack_788;
  auVar15 = vpmulld_avx2(*in_RDI,auVar50);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar68._16_8_ = uStack_490;
  auVar68._0_16_ = auVar12;
  auVar68._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar68);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar49._16_8_ = uStack_710;
  auVar49._0_16_ = auVar2;
  auVar49._24_8_ = uStack_708;
  auVar14 = vpmulld_avx2(in_RDI[5],auVar49);
  auVar48._16_8_ = uStack_6d0;
  auVar48._0_16_ = auVar3;
  auVar48._24_8_ = uStack_6c8;
  auVar15 = vpmulld_avx2(in_RDI[2],auVar48);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar67._16_8_ = uStack_490;
  auVar67._0_16_ = auVar12;
  auVar67._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar67);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar47._16_8_ = uStack_6d0;
  auVar47._0_16_ = auVar3;
  auVar47._24_8_ = uStack_6c8;
  auVar14 = vpmulld_avx2(in_RDI[5],auVar47);
  auVar46._16_8_ = uStack_710;
  auVar46._0_16_ = auVar2;
  auVar46._24_8_ = uStack_708;
  auVar15 = vpmulld_avx2(in_RDI[2],auVar46);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar66._16_8_ = uStack_490;
  auVar66._0_16_ = auVar12;
  auVar66._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar66);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar45._16_8_ = uStack_690;
  auVar45._0_16_ = auVar4;
  auVar45._24_8_ = uStack_688;
  auVar14 = vpmulld_avx2(in_RDI[3],auVar45);
  auVar44._16_8_ = uStack_650;
  auVar44._0_16_ = auVar5;
  auVar44._24_8_ = uStack_648;
  auVar15 = vpmulld_avx2(in_RDI[4],auVar44);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar65._16_8_ = uStack_490;
  auVar65._0_16_ = auVar12;
  auVar65._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar65);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar43._16_8_ = uStack_650;
  auVar43._0_16_ = auVar5;
  auVar43._24_8_ = uStack_648;
  auVar14 = vpmulld_avx2(in_RDI[3],auVar43);
  auVar42._16_8_ = uStack_690;
  auVar42._0_16_ = auVar4;
  auVar42._24_8_ = uStack_688;
  auVar15 = vpmulld_avx2(in_RDI[4],auVar42);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar64._16_8_ = uStack_490;
  auVar64._0_16_ = auVar12;
  auVar64._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar64);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar41._16_8_ = uStack_610;
  auVar41._0_16_ = auVar6;
  auVar41._24_8_ = uStack_608;
  auVar14 = vpmulld_avx2(in_RDI[1],auVar41);
  auVar40._16_8_ = uStack_5d0;
  auVar40._0_16_ = auVar7;
  auVar40._24_8_ = uStack_5c8;
  auVar15 = vpmulld_avx2(in_RDI[6],auVar40);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar63._16_8_ = uStack_490;
  auVar63._0_16_ = auVar12;
  auVar63._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar63);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar39._16_8_ = uStack_5d0;
  auVar39._0_16_ = auVar7;
  auVar39._24_8_ = uStack_5c8;
  auVar14 = vpmulld_avx2(in_RDI[1],auVar39);
  auVar38._16_8_ = uStack_610;
  auVar38._0_16_ = auVar6;
  auVar38._24_8_ = uStack_608;
  auVar15 = vpmulld_avx2(in_RDI[6],auVar38);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar62._16_8_ = uStack_490;
  auVar62._0_16_ = auVar12;
  auVar62._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar62);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  in0[1] = in_stack_ffffffffffffe260;
  in0[0] = in_stack_ffffffffffffe258;
  in0[2] = in_stack_ffffffffffffe268;
  in0[3] = in_stack_ffffffffffffe270;
  in1[0]._4_4_ = uVar73;
  in1[0]._0_4_ = uVar85;
  in1[1] = in_stack_ffffffffffffe240;
  in1[2] = in_stack_ffffffffffffe248;
  in1[3]._0_4_ = in_stack_ffffffffffffe250;
  in1[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_00[1] = in_stack_ffffffffffffe260;
  in0_00[0] = in_stack_ffffffffffffe258;
  in0_00[2] = in_stack_ffffffffffffe268;
  in0_00[3] = in_stack_ffffffffffffe270;
  in1_00[0]._4_4_ = uVar73;
  in1_00[0]._0_4_ = uVar85;
  in1_00[1] = in_stack_ffffffffffffe240;
  in1_00[2] = in_stack_ffffffffffffe248;
  in1_00[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_00[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_01[1] = in_stack_ffffffffffffe260;
  in0_01[0] = in_stack_ffffffffffffe258;
  in0_01[2] = in_stack_ffffffffffffe268;
  in0_01[3] = in_stack_ffffffffffffe270;
  in1_01[0]._4_4_ = uVar73;
  in1_01[0]._0_4_ = uVar85;
  in1_01[1] = in_stack_ffffffffffffe240;
  in1_01[2] = in_stack_ffffffffffffe248;
  in1_01[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_01[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_02[1] = in_stack_ffffffffffffe260;
  in0_02[0] = in_stack_ffffffffffffe258;
  in0_02[2] = in_stack_ffffffffffffe268;
  in0_02[3] = in_stack_ffffffffffffe270;
  in1_02[0]._4_4_ = uVar73;
  in1_02[0]._0_4_ = uVar85;
  in1_02[1] = in_stack_ffffffffffffe240;
  in1_02[2] = in_stack_ffffffffffffe248;
  in1_02[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_02[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  auVar37._8_8_ = uStack_1cb8;
  auVar37._0_8_ = local_1cc0;
  auVar37._16_8_ = uStack_1cb0;
  auVar37._24_8_ = uStack_1ca8;
  auVar36._16_8_ = uStack_590;
  auVar36._0_16_ = auVar8;
  auVar36._24_8_ = uStack_588;
  auVar14 = vpmulld_avx2(auVar37,auVar36);
  auVar35._8_8_ = uStack_1c98;
  auVar35._0_8_ = local_1ca0;
  auVar35._16_8_ = uStack_1c90;
  auVar35._24_8_ = uStack_1c88;
  auVar34._16_8_ = uStack_550;
  auVar34._0_16_ = auVar9;
  auVar34._24_8_ = uStack_548;
  auVar15 = vpmulld_avx2(auVar35,auVar34);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar61._16_8_ = uStack_490;
  auVar61._0_16_ = auVar12;
  auVar61._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar61);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar33._8_8_ = uStack_1cb8;
  auVar33._0_8_ = local_1cc0;
  auVar33._16_8_ = uStack_1cb0;
  auVar33._24_8_ = uStack_1ca8;
  auVar32._16_8_ = uStack_550;
  auVar32._0_16_ = auVar9;
  auVar32._24_8_ = uStack_548;
  auVar14 = vpmulld_avx2(auVar33,auVar32);
  auVar31._8_8_ = uStack_1c98;
  auVar31._0_8_ = local_1ca0;
  auVar31._16_8_ = uStack_1c90;
  auVar31._24_8_ = uStack_1c88;
  auVar30._16_8_ = uStack_590;
  auVar30._0_16_ = auVar8;
  auVar30._24_8_ = uStack_588;
  auVar15 = vpmulld_avx2(auVar31,auVar30);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar60._16_8_ = uStack_490;
  auVar60._0_16_ = auVar12;
  auVar60._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar60);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar29._8_8_ = uStack_1c78;
  auVar29._0_8_ = local_1c80;
  auVar29._16_8_ = uStack_1c70;
  auVar29._24_8_ = uStack_1c68;
  auVar28._16_8_ = uStack_510;
  auVar28._0_16_ = auVar10;
  auVar28._24_8_ = uStack_508;
  auVar14 = vpmulld_avx2(auVar29,auVar28);
  auVar27._8_8_ = uStack_1c58;
  auVar27._0_8_ = local_1c60;
  auVar27._16_8_ = uStack_1c50;
  auVar27._24_8_ = uStack_1c48;
  auVar26._16_8_ = uStack_590;
  auVar26._0_16_ = auVar8;
  auVar26._24_8_ = uStack_588;
  auVar15 = vpmulld_avx2(auVar27,auVar26);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar59._16_8_ = uStack_490;
  auVar59._0_16_ = auVar12;
  auVar59._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar59);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar25._8_8_ = uStack_1c78;
  auVar25._0_8_ = local_1c80;
  auVar25._16_8_ = uStack_1c70;
  auVar25._24_8_ = uStack_1c68;
  auVar24._16_8_ = uStack_590;
  auVar24._0_16_ = auVar8;
  auVar24._24_8_ = uStack_588;
  auVar14 = vpmulld_avx2(auVar25,auVar24);
  auVar23._8_8_ = uStack_1c58;
  auVar23._0_8_ = local_1c60;
  auVar23._16_8_ = uStack_1c50;
  auVar23._24_8_ = uStack_1c48;
  auVar22._16_8_ = uStack_510;
  auVar22._0_16_ = auVar10;
  auVar22._24_8_ = uStack_508;
  auVar15 = vpmulld_avx2(auVar23,auVar22);
  auVar14 = vpsubd_avx2(auVar14,auVar15);
  auVar58._16_8_ = uStack_490;
  auVar58._0_16_ = auVar12;
  auVar58._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar58);
  vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  in0_03[1] = in_stack_ffffffffffffe260;
  in0_03[0] = in_stack_ffffffffffffe258;
  in0_03[2] = in_stack_ffffffffffffe268;
  in0_03[3] = in_stack_ffffffffffffe270;
  in1_03[0]._4_4_ = uVar73;
  in1_03[0]._0_4_ = uVar85;
  in1_03[1] = in_stack_ffffffffffffe240;
  in1_03[2] = in_stack_ffffffffffffe248;
  in1_03[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_03[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_04[1] = in_stack_ffffffffffffe260;
  in0_04[0] = in_stack_ffffffffffffe258;
  in0_04[2] = in_stack_ffffffffffffe268;
  in0_04[3] = in_stack_ffffffffffffe270;
  in1_04[0]._4_4_ = uVar73;
  in1_04[0]._0_4_ = uVar85;
  in1_04[1] = in_stack_ffffffffffffe240;
  in1_04[2] = in_stack_ffffffffffffe248;
  in1_04[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_04[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_05[1] = in_stack_ffffffffffffe260;
  in0_05[0] = in_stack_ffffffffffffe258;
  in0_05[2] = in_stack_ffffffffffffe268;
  in0_05[3] = in_stack_ffffffffffffe270;
  in1_05[0]._4_4_ = uVar73;
  in1_05[0]._0_4_ = uVar85;
  in1_05[1] = in_stack_ffffffffffffe240;
  in1_05[2] = in_stack_ffffffffffffe248;
  in1_05[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_05[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  in0_06[1] = in_stack_ffffffffffffe260;
  in0_06[0] = in_stack_ffffffffffffe258;
  in0_06[2] = in_stack_ffffffffffffe268;
  in0_06[3] = in_stack_ffffffffffffe270;
  in1_06[0]._4_4_ = uVar73;
  in1_06[0]._0_4_ = uVar85;
  in1_06[1] = in_stack_ffffffffffffe240;
  in1_06[2] = in_stack_ffffffffffffe248;
  in1_06[3]._0_4_ = in_stack_ffffffffffffe250;
  in1_06[3]._4_4_ = in_stack_ffffffffffffe254;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar72,uVar84),(__m256i *)CONCAT44(uVar83,uVar82),
              (__m256i *)CONCAT44(uVar81,uVar80),(__m256i *)CONCAT44(uVar79,uVar77));
  local_1c20._8_8_ = uStack_1d18;
  local_1c20._0_8_ = local_1d20;
  local_1bc0._8_8_ = uStack_1cb8;
  local_1bc0._0_8_ = local_1cc0;
  auVar21._8_8_ = uStack_1cf8;
  auVar21._0_8_ = local_1d00;
  auVar21._16_8_ = uStack_1cf0;
  auVar21._24_8_ = uStack_1ce8;
  auVar20._16_8_ = uStack_4d0;
  auVar20._0_16_ = auVar11;
  auVar20._24_8_ = uStack_4c8;
  auVar15 = vpmulld_avx2(auVar21,auVar20);
  auVar18._8_8_ = uStack_1cd8;
  auVar18._0_8_ = local_1ce0;
  auVar18._16_8_ = uStack_1cd0;
  auVar18._24_8_ = uStack_1cc8;
  auVar17._16_8_ = uStack_4d0;
  auVar17._0_16_ = auVar11;
  auVar17._24_8_ = uStack_4c8;
  auVar16 = vpmulld_avx2(auVar18,auVar17);
  auVar14 = vpaddd_avx2(auVar15,auVar16);
  auVar57._16_8_ = uStack_490;
  auVar57._0_16_ = auVar12;
  auVar57._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar57);
  auVar17 = vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar14 = vpsubd_avx2(auVar15,auVar16);
  auVar56._16_8_ = uStack_490;
  auVar56._0_16_ = auVar12;
  auVar56._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar56);
  auVar18 = vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar19._8_8_ = uStack_1c78;
  auVar19._0_8_ = local_1c80;
  auVar19._16_8_ = uStack_1c70;
  auVar19._24_8_ = uStack_1c68;
  auVar15._16_8_ = uStack_4d0;
  auVar15._0_16_ = auVar11;
  auVar15._24_8_ = uStack_4c8;
  auVar15 = vpmulld_avx2(auVar19,auVar15);
  auVar16._8_8_ = uStack_1c58;
  auVar16._0_8_ = local_1c60;
  auVar16._16_8_ = uStack_1c50;
  auVar16._24_8_ = uStack_1c48;
  auVar14._16_8_ = uStack_4d0;
  auVar14._0_16_ = auVar11;
  auVar14._24_8_ = uStack_4c8;
  auVar16 = vpmulld_avx2(auVar16,auVar14);
  uVar86 = auVar16._0_8_;
  uVar87 = auVar16._8_8_;
  lVar88 = auVar16._16_8_;
  auVar14 = vpaddd_avx2(auVar15,auVar16);
  auVar55._16_8_ = uStack_490;
  auVar55._0_16_ = auVar12;
  auVar55._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar55);
  auVar19 = vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  auVar14 = vpsubd_avx2(auVar15,auVar16);
  auVar54._16_8_ = uStack_490;
  auVar54._0_16_ = auVar12;
  auVar54._24_8_ = uStack_488;
  auVar14 = vpaddd_avx2(auVar14,auVar54);
  auVar14 = vpsrad_avx2(auVar14,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_1e04 = 0x10;
    }
    else {
      local_1e04 = in_R8D + 6;
    }
    uVar77 = -(1 << ((char)local_1e04 - 1U & 0x1f));
    auVar78 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
    auVar78 = vpinsrd_avx(auVar78,uVar77,2);
    auVar78 = vpinsrd_avx(auVar78,uVar77,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
    auVar1 = vpinsrd_avx(auVar1,uVar77,2);
    auVar1 = vpinsrd_avx(auVar1,uVar77,3);
    local_3e0 = auVar78._0_8_;
    palStack_3d8 = auVar78._8_8_;
    palStack_3d0 = auVar1._0_8_;
    lStack_3c8 = auVar1._8_8_;
    uVar77 = (1 << ((char)local_1e04 - 1U & 0x1f)) - 1;
    auVar78 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
    auVar78 = vpinsrd_avx(auVar78,uVar77,2);
    auVar78 = vpinsrd_avx(auVar78,uVar77,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar77),uVar77,1);
    auVar1 = vpinsrd_avx(auVar1,uVar77,2);
    vpinsrd_avx(auVar1,uVar77,3);
    auVar78 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar78;
    palStack_388 = auVar78._8_8_;
    iVar74 = auVar78._4_4_;
    in0_07[0]._4_4_ = local_1e04;
    in0_07[0]._0_4_ = in_stack_ffffffffffffe298;
    in0_07[1] = uVar86;
    in0_07[2] = uVar87;
    in0_07[3] = lVar88;
    in1_07[1] = in_stack_ffffffffffffe280._0_8_;
    in1_07[2] = in_stack_ffffffffffffe280._8_8_;
    in1_07[3] = in_stack_ffffffffffffe280._16_8_;
    in1_07[0] = lStack_3c8;
    neg_shift_avx2(in0_07,in1_07,palStack_3d0,palStack_3d8,local_3e0,palStack_388,iVar74);
    in0_08[0]._4_4_ = local_1e04;
    in0_08[0]._0_4_ = in_stack_ffffffffffffe298;
    in0_08[1] = uVar86;
    in0_08[2] = uVar87;
    in0_08[3] = lVar88;
    in1_08[1] = in_stack_ffffffffffffe280._0_8_;
    in1_08[2] = in_stack_ffffffffffffe280._8_8_;
    in1_08[3] = in_stack_ffffffffffffe280._16_8_;
    in1_08[0] = lStack_3c8;
    neg_shift_avx2(in0_08,in1_08,palStack_3d0,palStack_3d8,local_3e0,palStack_388,iVar74);
    in0_09[0]._4_4_ = local_1e04;
    in0_09[0]._0_4_ = in_stack_ffffffffffffe298;
    in0_09[1] = uVar86;
    in0_09[2] = uVar87;
    in0_09[3] = lVar88;
    in1_09[1] = in_stack_ffffffffffffe280._0_8_;
    in1_09[2] = in_stack_ffffffffffffe280._8_8_;
    in1_09[3] = in_stack_ffffffffffffe280._16_8_;
    in1_09[0] = lStack_3c8;
    neg_shift_avx2(in0_09,in1_09,palStack_3d0,palStack_3d8,local_3e0,palStack_388,iVar74);
    in0_10[0]._4_4_ = local_1e04;
    in0_10[0]._0_4_ = in_stack_ffffffffffffe298;
    in0_10[1] = uVar86;
    in0_10[2] = uVar87;
    in0_10[3] = lVar88;
    in1_10[1] = in_stack_ffffffffffffe280._0_8_;
    in1_10[2] = in_stack_ffffffffffffe280._8_8_;
    in1_10[3] = in_stack_ffffffffffffe280._16_8_;
    in1_10[0] = lStack_3c8;
    neg_shift_avx2(in0_10,in1_10,palStack_3d0,palStack_3d8,local_3e0,palStack_388,iVar74);
  }
  else {
    local_1c40 = local_1d40._0_8_;
    uStack_1c38 = local_1d40._8_8_;
    uStack_1c30 = local_1d40._16_8_;
    *in_RSI = local_1c40;
    in_RSI[1] = uStack_1c38;
    in_RSI[2] = uStack_1c30;
    in_RSI[3] = uStack_1d28;
    auVar71._16_8_ = uStack_1cb0;
    auVar71._0_16_ = local_1bc0;
    auVar71._24_8_ = uStack_1ca8;
    auVar15 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar71);
    *(undefined1 (*) [32])(in_RSI + 4) = auVar15;
    local_1b80 = auVar19._0_8_;
    uStack_1b78 = auVar19._8_8_;
    uStack_1b70 = auVar19._16_8_;
    uStack_1b68 = auVar19._24_8_;
    in_RSI[8] = local_1b80;
    in_RSI[9] = uStack_1b78;
    in_RSI[10] = uStack_1b70;
    in_RSI[0xb] = uStack_1b68;
    auVar15 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar17);
    *(undefined1 (*) [32])(in_RSI + 0xc) = auVar15;
    local_1be0 = auVar18._0_8_;
    uStack_1bd8 = auVar18._8_8_;
    uStack_1bd0 = auVar18._16_8_;
    uStack_1bc8 = auVar18._24_8_;
    in_RSI[0x10] = local_1be0;
    in_RSI[0x11] = uStack_1bd8;
    in_RSI[0x12] = uStack_1bd0;
    in_RSI[0x13] = uStack_1bc8;
    auVar14 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar14);
    *(undefined1 (*) [32])(in_RSI + 0x14) = auVar14;
    in_RSI[0x18] = local_1ca0;
    in_RSI[0x19] = uStack_1c98;
    in_RSI[0x1a] = uStack_1c90;
    in_RSI[0x1b] = uStack_1c88;
    auVar70._16_8_ = uStack_1d10;
    auVar70._0_16_ = local_1c20;
    auVar70._24_8_ = uStack_1d08;
    auVar14 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar70);
    *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar14;
  }
  return;
}

Assistant:

static void iadst8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                          int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm256_mullo_epi32(in[7], cospi4);
  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(u[0], x);
  u[0] = _mm256_add_epi32(u[0], rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  u[1] = _mm256_mullo_epi32(in[7], cospi60);
  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(u[1], x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  u[2] = _mm256_mullo_epi32(in[5], cospi20);
  x = _mm256_mullo_epi32(in[2], cospi44);
  u[2] = _mm256_add_epi32(u[2], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_mullo_epi32(in[5], cospi44);
  x = _mm256_mullo_epi32(in[2], cospi20);
  u[3] = _mm256_sub_epi32(u[3], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  u[4] = _mm256_mullo_epi32(in[3], cospi36);
  x = _mm256_mullo_epi32(in[4], cospi28);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(in[3], cospi28);
  x = _mm256_mullo_epi32(in[4], cospi36);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(in[1], cospi52);
  x = _mm256_mullo_epi32(in[6], cospi12);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(in[1], cospi12);
  x = _mm256_mullo_epi32(in[6], cospi52);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 3
  addsub_avx2(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_avx2(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm256_mullo_epi32(v[4], cospi16);
  x = _mm256_mullo_epi32(v[5], cospi48);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(v[4], cospi48);
  x = _mm256_mullo_epi32(v[5], cospi16);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(v[6], cospim48);
  x = _mm256_mullo_epi32(v[7], cospi16);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(v[6], cospi16);
  x = _mm256_mullo_epi32(v[7], cospim48);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 5
  addsub_avx2(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_avx2(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm256_mullo_epi32(v[2], cospi32);
  x = _mm256_mullo_epi32(v[3], cospi32);
  u[2] = _mm256_add_epi32(v[0], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(v[0], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  v[0] = _mm256_mullo_epi32(v[6], cospi32);
  x = _mm256_mullo_epi32(v[7], cospi32);
  u[6] = _mm256_add_epi32(v[0], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(v[0], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}